

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O3

void __thiscall
Cache::Cache(Cache *this,MemoryManager *manager,Policy policy,Cache *lowerCache,bool writeBack,
            bool writeAllocate)

{
  bool bVar1;
  undefined8 extraout_RAX;
  Cache *this_00;
  vector<Cache::Block,_std::allocator<Cache::Block>_> *unaff_R15;
  
  (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->referenceCounter = 0;
  this->memory = manager;
  (this->policy).cacheSize = policy.cacheSize;
  (this->policy).blockSize = policy.blockSize;
  (this->policy).blockNum = policy.blockNum;
  (this->policy).associativity = policy.associativity;
  (this->policy).hitLatency = policy.hitLatency;
  (this->policy).missLatency = policy.missLatency;
  this->lowerCache = lowerCache;
  this_00 = this;
  bVar1 = isPolicyValid(this);
  if (bVar1) {
    initCache(this);
    (this->statistics).numRead = 0;
    (this->statistics).numWrite = 0;
    (this->statistics).numHit = 0;
    (this->statistics).numMiss = 0;
    (this->statistics).totalCycles = 0;
    this->writeBack = writeBack;
    this->writeAllocate = writeAllocate;
    return;
  }
  Cache(this_00);
  std::vector<Cache::Block,_std::allocator<Cache::Block>_>::~vector(unaff_R15);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

Cache::Cache(MemoryManager *manager, Policy policy, Cache *lowerCache,
             bool writeBack, bool writeAllocate) {
  this->referenceCounter = 0;
  this->memory = manager;
  this->policy = policy;
  this->lowerCache = lowerCache;
  if (!this->isPolicyValid()) {
    fprintf(stderr, "Policy invalid!\n");
    exit(-1);
  }
  this->initCache();
  this->statistics.numRead = 0;
  this->statistics.numWrite = 0;
  this->statistics.numHit = 0;
  this->statistics.numMiss = 0;
  this->statistics.totalCycles = 0;
  this->writeBack = writeBack;
  this->writeAllocate = writeAllocate;
}